

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImGuiStb::stb_textedit_find_charpos
               (StbFindState *find,ImGuiInputTextState *str,int n,int single_line)

{
  float fVar1;
  int in_ECX;
  float in_EDX;
  ImGuiInputTextState *in_RSI;
  float *in_RDI;
  float fVar2;
  int first;
  int i;
  int z;
  int prev_start;
  StbTexteditRow r;
  float fVar3;
  int line_start_idx;
  float fVar4;
  float local_30;
  float in_stack_ffffffffffffffd4;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  float in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  
  fVar4 = 0.0;
  fVar1 = (float)STB_TEXTEDIT_STRINGLEN(in_RSI);
  if (in_EDX == fVar1) {
    if (in_ECX == 0) {
      in_RDI[1] = 0.0;
      *in_RDI = 0.0;
      in_RDI[2] = 1.0;
      fVar2 = 0.0;
      while (fVar3 = fVar2, (int)fVar3 < (int)fVar1) {
        STB_TEXTEDIT_LAYOUTROW
                  ((StbTexteditRow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   (ImGuiInputTextState *)
                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                   (int)in_stack_ffffffffffffffd4);
        fVar4 = fVar3;
        fVar2 = (float)((int)in_stack_ffffffffffffffe4 + (int)fVar3);
      }
      in_RDI[3] = fVar3;
      in_RDI[4] = 0.0;
      in_RDI[5] = fVar4;
    }
    else {
      STB_TEXTEDIT_LAYOUTROW
                ((StbTexteditRow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (ImGuiInputTextState *)
                 CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (int)in_stack_ffffffffffffffd4);
      in_RDI[1] = 0.0;
      in_RDI[3] = 0.0;
      in_RDI[4] = fVar1;
      in_RDI[2] = in_stack_ffffffffffffffe0 - in_stack_ffffffffffffffdc;
      *in_RDI = in_stack_ffffffffffffffd4;
    }
  }
  else {
    in_RDI[1] = 0.0;
    fVar2 = 0.0;
    while (fVar3 = fVar2,
          STB_TEXTEDIT_LAYOUTROW
                    ((StbTexteditRow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                     ,(ImGuiInputTextState *)
                      CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (int)in_stack_ffffffffffffffd4),
          (int)fVar3 + (int)in_stack_ffffffffffffffe4 <= (int)in_EDX) {
      in_RDI[1] = in_stack_ffffffffffffffd8 + in_RDI[1];
      fVar2 = (float)((int)in_stack_ffffffffffffffe4 + (int)fVar3);
      fVar4 = fVar3;
    }
    in_RDI[3] = fVar3;
    in_RDI[4] = in_stack_ffffffffffffffe4;
    in_RDI[2] = in_stack_ffffffffffffffe0 - in_stack_ffffffffffffffdc;
    in_RDI[5] = fVar4;
    *in_RDI = local_30;
    for (line_start_idx = 0; (int)fVar3 + line_start_idx < (int)in_EDX;
        line_start_idx = line_start_idx + 1) {
      fVar2 = STB_TEXTEDIT_GETWIDTH
                        ((ImGuiInputTextState *)CONCAT44(fVar4,fVar1),line_start_idx,(int)fVar3);
      *in_RDI = fVar2 + *in_RDI;
    }
  }
  return;
}

Assistant:

static void stb_textedit_find_charpos(StbFindState *find, STB_TEXTEDIT_STRING *str, int n, int single_line)
{
   StbTexteditRow r;
   int prev_start = 0;
   int z = STB_TEXTEDIT_STRINGLEN(str);
   int i=0, first;

   if (n == z) {
      // if it's at the end, then find the last line -- simpler than trying to
      // explicitly handle this case in the regular code
      if (single_line) {
         STB_TEXTEDIT_LAYOUTROW(&r, str, 0);
         find->y = 0;
         find->first_char = 0;
         find->length = z;
         find->height = r.ymax - r.ymin;
         find->x = r.x1;
      } else {
         find->y = 0;
         find->x = 0;
         find->height = 1;
         while (i < z) {
            STB_TEXTEDIT_LAYOUTROW(&r, str, i);
            prev_start = i;
            i += r.num_chars;
         }
         find->first_char = i;
         find->length = 0;
         find->prev_first = prev_start;
      }
      return;
   }

   // search rows to find the one that straddles character n
   find->y = 0;

   for(;;) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (n < i + r.num_chars)
         break;
      prev_start = i;
      i += r.num_chars;
      find->y += r.baseline_y_delta;
   }

   find->first_char = first = i;
   find->length = r.num_chars;
   find->height = r.ymax - r.ymin;
   find->prev_first = prev_start;

   // now scan to find xpos
   find->x = r.x0;
   i = 0;
   for (i=0; first+i < n; ++i)
      find->x += STB_TEXTEDIT_GETWIDTH(str, first, i);
}